

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile_exceptions.hpp
# Opt level: O2

void __thiscall CompoundFile::Exception::~Exception(Exception *this)

{
  *(undefined ***)this = &PTR__Exception_00110c30;
  std::__cxx11::wstring::~wstring((wstring *)&this->m_what);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

inline
Exception::~Exception() noexcept
{
}